

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar5 == '\0') {
    sVar6 = 0;
  }
  else {
    if ((uVar5 & 1) == 0) {
      sVar6 = 0;
    }
    else {
      sVar1 = ((this->name_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar1 = ((this->extendee_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      sVar1 = ((this->type_name_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 8) != 0) {
      sVar1 = ((this->default_value_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x10) != 0) {
      sVar1 = ((this->json_name_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x20) != 0) {
      sVar4 = FieldOptions::ByteSizeLong(this->options_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x40) != 0) {
      if (this->number_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar3 = this->number_ | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar7;
    }
    if ((char)uVar5 < '\0') {
      if (this->oneof_index_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar3 = this->oneof_index_ | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar7;
    }
  }
  sVar4 = sVar6;
  if ((uVar5 & 0x700) != 0) {
    sVar4 = sVar6 + 3;
    if ((uVar5 >> 8 & 1) == 0) {
      sVar4 = sVar6;
    }
    if ((uVar5 >> 9 & 1) != 0) {
      if (this->label_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar3 = this->label_ | 1;
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar7;
    }
    if ((uVar5 >> 10 & 1) != 0) {
      if (this->type_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar5 = this->type_ | 1;
        iVar2 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = uVar7 + sVar4;
    }
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    sVar6 = internal::ComputeUnknownFieldsSize
                      (&(this->super_Message).super_MessageLite._internal_metadata_,sVar4,
                       &this->_cached_size_);
    return sVar6;
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar4;
  return sVar4;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string extendee = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_extendee());
    }

    // optional string type_name = 6;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_type_name());
    }

    // optional string default_value = 7;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_default_value());
    }

    // optional string json_name = 10;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 number = 3;
    if (cached_has_bits & 0x00000040u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_number());
    }

    // optional int32 oneof_index = 9;
    if (cached_has_bits & 0x00000080u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_oneof_index());
    }

  }
  if (cached_has_bits & 0x00000700u) {
    // optional bool proto3_optional = 17;
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (cached_has_bits & 0x00000200u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}